

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxKeys.cxx
# Opt level: O0

PressedKey __thiscall LinuxKeys::pressed(LinuxKeys *this)

{
  PressedKey PVar1;
  int *in_RDI;
  int charactersBuffered;
  PressedKey keys;
  int local_14 [3];
  PressedKey local_8;
  
  local_14[0] = 0;
  ioctl(*in_RDI,0x541b,local_14);
  PressedKey::PressedKey(&local_8,local_14[0] != 0,0);
  if (local_14[0] == 1) {
    local_8.key = fgetc(_stdin);
    local_14[0] = local_14[0] + -1;
  }
  for (; local_14[0] != 0; local_14[0] = local_14[0] + -1) {
    fgetc(_stdin);
  }
  PVar1.key = local_8.key;
  PVar1.isPressed = local_8.isPressed;
  PVar1._1_3_ = local_8._1_3_;
  return PVar1;
}

Assistant:

LinuxKeys::PressedKey
LinuxKeys::pressed() const
{
    int charactersBuffered = 0;
    ioctl(stdinFd_, FIONREAD, &charactersBuffered);

    PressedKey keys((charactersBuffered != 0));

    if (charactersBuffered == 1)
    {
        keys.key = fgetc(stdin);
        --charactersBuffered;
    }

    while (charactersBuffered)
    {
        fgetc(stdin);
        --charactersBuffered;
    }

    return keys;
}